

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_test.cc
# Opt level: O0

void re2::MultithreadedBuildEntireDFA(void)

{
  BuildThread *pBVar1;
  Prog *pPVar2;
  ostream *poVar3;
  reference ppBVar4;
  int local_6c0;
  int local_6bc;
  int j_2;
  int j_1;
  BuildThread *t_1;
  undefined1 local_6a8 [4];
  int j;
  vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_> threads;
  Prog *prog_1;
  StringPiece local_388;
  Regexp *local_378;
  Regexp *re_1;
  BuildThread *pBStack_368;
  int i_1;
  BuildThread *t;
  Prog *local_1e0;
  Prog *prog;
  StringPiece local_58;
  Regexp *local_48;
  Regexp *re;
  int i;
  allocator local_29;
  string local_28 [8];
  string s;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"a",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  for (re._0_4_ = 0; (int)re < FLAGS_size; re._0_4_ = (int)re + 1) {
    std::__cxx11::string::operator+=(local_28,"[ab]");
  }
  std::__cxx11::string::operator+=(local_28,"b");
  StringPiece::StringPiece(&local_58,(string *)local_28);
  local_48 = Regexp::Parse(&local_58,LikePerl,(RegexpStatus *)0x0);
  if (local_48 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&prog,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x30);
    poVar3 = LogMessage::stream((LogMessage *)&prog);
    std::operator<<(poVar3,"Check failed: re");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&prog);
  }
  local_1e0 = Regexp::CompileToProg(local_48,0);
  if (local_1e0 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&t,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x32);
    poVar3 = LogMessage::stream((LogMessage *)&t);
    std::operator<<(poVar3,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&t);
  }
  pBVar1 = (BuildThread *)operator_new(0x20);
  BuildThread::BuildThread(pBVar1,local_1e0);
  pBStack_368 = pBVar1;
  Thread::SetJoinable((Thread *)pBVar1,true);
  Thread::Start(&pBStack_368->super_Thread);
  Thread::Join(&pBStack_368->super_Thread);
  if (pBStack_368 != (BuildThread *)0x0) {
    (*(pBStack_368->super_Thread)._vptr_Thread[1])();
  }
  pPVar2 = local_1e0;
  if (local_1e0 != (Prog *)0x0) {
    Prog::~Prog(local_1e0);
    operator_delete(pPVar2);
  }
  Regexp::Decref(local_48);
  for (re_1._4_4_ = 0; re_1._4_4_ < FLAGS_repeat; re_1._4_4_ = re_1._4_4_ + 1) {
    StringPiece::StringPiece(&local_388,(string *)local_28);
    local_378 = Regexp::Parse(&local_388,LikePerl,(RegexpStatus *)0x0);
    if (local_378 == (Regexp *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&prog_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0x3f);
      poVar3 = LogMessage::stream((LogMessage *)&prog_1);
      std::operator<<(poVar3,"Check failed: re");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&prog_1);
    }
    pPVar2 = Regexp::CompileToProg(local_378,0);
    if (pPVar2 == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)
                 &threads.
                  super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0x41);
      poVar3 = LogMessage::stream((LogMessage *)
                                  &threads.
                                   super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar3,"Check failed: prog");
      LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)
                 &threads.
                  super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>::vector
              ((vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_> *)local_6a8);
    for (t_1._4_4_ = 0; t_1._4_4_ < FLAGS_threads; t_1._4_4_ = t_1._4_4_ + 1) {
      pBVar1 = (BuildThread *)operator_new(0x20);
      BuildThread::BuildThread(pBVar1,pPVar2);
      _j_2 = pBVar1;
      Thread::SetJoinable((Thread *)pBVar1,true);
      std::vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>::push_back
                ((vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_> *)local_6a8,
                 (value_type *)&j_2);
    }
    for (local_6bc = 0; local_6bc < FLAGS_threads; local_6bc = local_6bc + 1) {
      ppBVar4 = std::vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>::operator[]
                          ((vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_> *)
                           local_6a8,(long)local_6bc);
      Thread::Start(&(*ppBVar4)->super_Thread);
    }
    for (local_6c0 = 0; local_6c0 < FLAGS_threads; local_6c0 = local_6c0 + 1) {
      ppBVar4 = std::vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>::operator[]
                          ((vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_> *)
                           local_6a8,(long)local_6c0);
      Thread::Join(&(*ppBVar4)->super_Thread);
      ppBVar4 = std::vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>::operator[]
                          ((vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_> *)
                           local_6a8,(long)local_6c0);
      if (*ppBVar4 != (value_type)0x0) {
        (*((*ppBVar4)->super_Thread)._vptr_Thread[1])();
      }
    }
    Prog::BuildEntireDFA(pPVar2,kFirstMatch);
    if (pPVar2 != (Prog *)0x0) {
      Prog::~Prog(pPVar2);
      operator_delete(pPVar2);
    }
    Regexp::Decref(local_378);
    std::vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>::~vector
              ((vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_> *)local_6a8);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(Multithreaded, BuildEntireDFA) {
  // Create regexp with 2^FLAGS_size states in DFA.
  string s = "a";
  for (int i = 0; i < FLAGS_size; i++)
    s += "[ab]";
  s += "b";

  // Check that single-threaded code works.
  {
    //LOG(INFO) << s;
    Regexp* re = Regexp::Parse(s, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    BuildThread* t = new BuildThread(prog);
    t->SetJoinable(true);
    t->Start();
    t->Join();
    delete t;
    delete prog;
    re->Decref();
  }

  // Build the DFA simultaneously in a bunch of threads.
  for (int i = 0; i < FLAGS_repeat; i++) {
    Regexp* re = Regexp::Parse(s, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);

    vector<BuildThread*> threads;
    for (int j = 0; j < FLAGS_threads; j++) {
      BuildThread *t = new BuildThread(prog);
      t->SetJoinable(true);
      threads.push_back(t);
    }
    for (int j = 0; j < FLAGS_threads; j++)
      threads[j]->Start();
    for (int j = 0; j < FLAGS_threads; j++) {
      threads[j]->Join();
      delete threads[j];
    }

    // One more compile, to make sure everything is okay.
    prog->BuildEntireDFA(Prog::kFirstMatch);
    delete prog;
    re->Decref();
  }
}